

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O3

int bfgs_min(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
            double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,double stol,
            double *xf)

{
  double dVar1;
  double eps2;
  int iVar2;
  int iVar3;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  double *L;
  double *f_00;
  ulong uVar4;
  char *__format;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int local_68;
  
  sVar5 = (long)N * 8;
  f = (double *)malloc(sVar5);
  array = (double *)malloc(sVar5);
  xi_00 = (double *)malloc(sVar5);
  x = (double *)malloc(sVar5);
  L = (double *)malloc((long)N * sVar5);
  f_00 = (double *)malloc(sVar5);
  *niter = 0;
  if (eps < 0.0) {
    eps2 = sqrt(eps);
  }
  else {
    eps2 = SQRT(eps);
  }
  if (0 < N) {
    uVar4 = 0;
    do {
      xi[uVar4] = dx[uVar4] * xi[uVar4];
      dx[uVar4] = 1.0 / dx[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)N != uVar4);
  }
  dVar7 = (*funcpt->funcpt)(xi,N,funcpt->params);
  dVar8 = ABS(dVar7);
  local_68 = 0;
  if (1.79769313486232e+308 <= dVar8) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    local_68 = 0xf;
  }
  if (NAN(dVar7)) {
    printf("Program Exiting as the function returns NaN");
    local_68 = 0xf;
  }
  iVar2 = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,f);
  if (iVar2 == 0xf) {
    local_68 = 0xf;
  }
  dVar7 = 0.0;
  if (maxstep <= 0.0) {
    dVar9 = 0.0;
    if (0 < N) {
      uVar4 = 0;
      dVar9 = 0.0;
      do {
        dVar1 = dx[uVar4];
        dVar9 = dVar9 + dVar1 * dVar1;
        dVar7 = dVar7 + dVar1 * xi[uVar4] * dVar1 * xi[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)N != uVar4);
    }
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    if (dVar9 <= dVar7) {
      maxstep = dVar7 * 1000.0;
    }
    else {
      maxstep = dVar9 * 1000.0;
    }
  }
  if (N < 1) {
    dVar7 = array_max_abs(array,N);
    if (dVar7 <= gtol * 0.001) {
      local_68 = 1;
    }
LAB_0012e5ec:
    if (dVar8 <= fsval) {
      dVar8 = fsval;
    }
    if (dVar8 < 0.0) {
      sqrt(dVar8);
    }
  }
  else {
    dVar7 = dVar8;
    if (dVar8 <= ABS(fsval)) {
      dVar7 = ABS(fsval);
    }
    uVar6 = (ulong)(uint)N;
    uVar4 = 0;
    do {
      dVar9 = ABS(xi[uVar4]);
      if (ABS(xi[uVar4]) <= 1.0 / ABS(dx[uVar4])) {
        dVar9 = 1.0 / ABS(dx[uVar4]);
      }
      array[uVar4] = (ABS(f[uVar4]) * dVar9) / dVar7;
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
    dVar7 = array_max_abs(array,N);
    if (dVar7 <= gtol * 0.001) {
      if (N < 1) {
        local_68 = 1;
        goto LAB_0012e5ec;
      }
      uVar4 = 0;
      do {
        xf[uVar4] = xi[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar6 != uVar4);
      local_68 = 1;
    }
    if (dVar8 <= fsval) {
      dVar8 = fsval;
    }
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    if (0 < N) {
      uVar4 = 0;
      sVar5 = 0;
      do {
        *(double *)((long)L + (uVar4 & 0xffffffff) * 8 + sVar5) =
             *(double *)((long)dx + sVar5) * dVar8;
        if (sVar5 != 0) {
          memset(L + uVar4,0,sVar5);
        }
        sVar5 = sVar5 + 8;
        uVar4 = uVar4 + uVar6;
      } while (uVar6 * 8 != sVar5);
      if (0 < N) {
        memcpy(xi_00,xi,uVar6 << 3);
      }
    }
  }
  if (local_68 == 0) {
    do {
      if (MAXITER <= *niter) {
        local_68 = 4;
        break;
      }
      *niter = *niter + 1;
      scale(f,1,N,-1.0);
      linsolve_lower(L,N,f,x);
      scale(f,1,N,-1.0);
      iVar2 = lnsrch(funcpt,xi_00,f,x,N,dx,maxstep,stol,xf);
      dVar8 = (*funcpt->funcpt)(xf,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar8)) {
        __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_0012e7ed:
        printf(__format);
LAB_0012e7f4:
        local_68 = 0xf;
        break;
      }
      if (NAN(dVar8)) {
        __format = "Program Exiting as the function returns NaN";
        goto LAB_0012e7ed;
      }
      iVar3 = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,f_00);
      if (iVar3 == 0xf) goto LAB_0012e7f4;
      local_68 = stopcheck(dVar8,N,xi_00,xf,f_00,dx,fsval,gtol,stol,iVar2);
      bfgs_factored(L,N,eps,xi_00,xf,f,f_00);
      if (0 < N) {
        memcpy(xi_00,xf,(ulong)(uint)N << 3);
        memcpy(f,f_00,(ulong)(uint)N << 3);
      }
    } while (local_68 == 0);
  }
  if (0 < N) {
    uVar4 = 0;
    do {
      xi[uVar4] = dx[uVar4] * xi[uVar4];
      dx[uVar4] = 1.0 / dx[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)N != uVar4);
  }
  free(f);
  free(array);
  free(xi_00);
  free(L);
  free(x);
  free(f_00);
  return local_68;
}

Assistant:

int bfgs_min(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double fsval,double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double stol,double *xf)  {
	int rcode,gfdcode;
	int i,siter,retval;
	double dt1,dt2;
	double fx,num,den,stop0,fxf,eps2;
	double *jac,*hess,*scheck,*xc,*L,*step,*jacf;
	
	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	hess = (double*) malloc(sizeof(double) *N * N);
	L = (double*) malloc(sizeof(double) *N * N);
	jacf = (double*) malloc(sizeof(double) *N);
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 15 -  Failure as Inf/Nan Values encountered 
	 * 
	 */ 
	
	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);
	gfdcode = 0;

	//set values
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}

	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}


	//maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}
	
	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
	}
	
	//hessian_fd(funcpt,xi,N,dx,hess);
	inithess_lower(L,N,fx,fsval,dx);
	
	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	
	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		scale(jac,1,N,-1.0);
		
		linsolve_lower(L,N,jac,step);
		
		scale(jac,1,N,-1.0);

		retval = lnsrch(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);

		fxf = FUNCPT_EVAL(funcpt, xf, N);
		if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			rcode = 15;
			break;
		}
		if (fxf != fxf) {
			printf("Program Exiting as the function returns NaN");
			rcode = 15;
			break;
		}

		gfdcode = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,jacf);
		if (gfdcode == 15) {
			rcode = 15;
			break;
		}
		rcode = stopcheck(fxf,N,xc,xf,jacf,dx,fsval,gtol,stol,retval);
		//hessian_fd(funcpt,xf,N,dx,hess);
		//bfgs_naive(hess,N,xc,xf,jac,jacf);
		bfgs_factored(L,N,eps,xc,xf,jac,jacf);
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
			jac[i] = jacf[i];
		}
	}
	
	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}
	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	free(jacf);
	return rcode;
}